

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O3

void __thiscall ADSBHubConnection::ProcessPlaneData(ADSBHubConnection *this)

{
  FDKeyTy *__k;
  positionTy *this_00;
  double dVar1;
  bool bVar2;
  int iVar3;
  mapped_type *this_01;
  long lVar4;
  FDStaticData *pFVar5;
  FDDynamicData *pFVar6;
  byte bVar7;
  unique_lock<std::mutex> mapFdLock;
  positionTy viewPos;
  unique_lock<std::mutex> local_1e0;
  double local_1d0;
  FDStaticData local_1c8;
  
  bVar7 = 0;
  if (NAN((this->pos)._ts)) {
    lVar4 = std::chrono::_V2::system_clock::now();
    dVar1 = (double)(lVar4 / 1000) / 1000000.0 + -3.0;
    (this->pos)._ts = dVar1;
    (this->dyn).ts = dVar1;
  }
  __k = &this->fdKey;
  if ((this->fdKey).key._M_string_length != 0) {
    this_00 = &this->pos;
    bVar2 = positionTy::isNormal(this_00,true);
    if (bVar2) {
      DataRefs::GetViewPos();
      local_1d0 = CoordDistance(this_00,(positionTy *)&local_1c8);
      if (local_1d0 < (double)(dataRefs.fdStdDistance * 0x73c)) {
        local_1e0._M_device = &mapFdMutex;
        local_1e0._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_1e0);
        local_1e0._M_owns = true;
        this_01 = std::
                  map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                  ::operator[](&mapFd,__k);
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this_01->dataAccessMutex);
        if (iVar3 != 0) {
          std::__throw_system_error(iVar3);
        }
        std::unique_lock<std::mutex>::unlock(&local_1e0);
        if ((this_01->acKey).key._M_string_length == 0) {
          LTFlightData::SetKey(this_01,__k);
        }
        LTFlightData::UpdateData(this_01,&this->stat,local_1d0,DATREQU_NONE);
        (this->dyn).pChannel = (LTChannel *)this;
        LTFlightData::AddDynData(this_01,&this->dyn,0,0,this_00);
        pthread_mutex_unlock((pthread_mutex_t *)&this_01->dataAccessMutex);
        std::unique_lock<std::mutex>::~unique_lock(&local_1e0);
      }
    }
  }
  LTFlightData::FDKeyTy::clear(__k);
  local_1c8.reg._M_dataplus._M_p = (pointer)&local_1c8.reg.field_2;
  local_1c8.reg._M_string_length = 0;
  local_1c8.reg.field_2._M_local_buf[0] = '\0';
  local_1c8.country._M_dataplus._M_p = (pointer)&local_1c8.country.field_2;
  local_1c8.country._M_string_length = 0;
  local_1c8.country.field_2._M_local_buf[0] = '\0';
  local_1c8.acTypeIcao._M_dataplus._M_p = (pointer)&local_1c8.acTypeIcao.field_2;
  local_1c8.acTypeIcao._M_string_length = 0;
  local_1c8.acTypeIcao.field_2._M_local_buf[0] = '\0';
  local_1c8.man._M_dataplus._M_p = (pointer)&local_1c8.man.field_2;
  local_1c8.man._M_string_length = 0;
  local_1c8.man.field_2._M_local_buf[0] = '\0';
  local_1c8.mdl._M_dataplus._M_p = (pointer)&local_1c8.mdl.field_2;
  local_1c8.mdl._M_string_length = 0;
  local_1c8.mdl.field_2._M_local_buf[0] = '\0';
  local_1c8.catDescr._M_dataplus._M_p = (pointer)&local_1c8.catDescr.field_2;
  local_1c8.catDescr._M_string_length = 0;
  local_1c8.catDescr.field_2._M_local_buf[0] = '\0';
  local_1c8.engType = -1;
  local_1c8.engMount = -1;
  local_1c8.year = 0;
  local_1c8.mil = false;
  local_1c8.pDoc8643 = (Doc8643 *)0x0;
  local_1c8.call._M_dataplus._M_p = (pointer)&local_1c8.call.field_2;
  local_1c8.call._M_string_length = 0;
  local_1c8.call.field_2._M_local_buf[0] = '\0';
  local_1c8.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.flight._M_dataplus._M_p = (pointer)&local_1c8.flight.field_2;
  local_1c8.flight._M_string_length = 0;
  local_1c8.flight.field_2._M_local_buf[0] = '\0';
  local_1c8.slug._M_dataplus._M_p = (pointer)&local_1c8.slug.field_2;
  local_1c8.slug._M_string_length = 0;
  local_1c8.slug.field_2._M_local_buf[0] = '\0';
  local_1c8.op._M_dataplus._M_p = (pointer)&local_1c8.op.field_2;
  local_1c8.op._M_string_length = 0;
  local_1c8.op.field_2._M_local_buf[0] = '\0';
  local_1c8.opIcao._M_dataplus._M_p = (pointer)&local_1c8.opIcao.field_2;
  local_1c8.opIcao._M_string_length = 0;
  local_1c8.opIcao.field_2._M_local_buf[0] = '\0';
  local_1c8.bDataMaster = false;
  local_1c8.bDataRoute = false;
  LTFlightData::FDStaticData::operator=(&this->stat,&local_1c8);
  LTFlightData::FDStaticData::~FDStaticData(&local_1c8);
  LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)&local_1c8);
  pFVar5 = &local_1c8;
  pFVar6 = &this->dyn;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pFVar6->radar).size = (long)(pFVar5->reg)._M_dataplus._M_p;
    pFVar5 = (FDStaticData *)((long)pFVar5 + (ulong)bVar7 * -0x10 + 8);
    pFVar6 = (FDDynamicData *)((long)pFVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  (this->pos)._lat = NAN;
  (this->pos)._lon = NAN;
  (this->pos)._alt = NAN;
  (this->pos)._ts = NAN;
  (this->pos)._head = NAN;
  (this->pos)._pitch = NAN;
  (this->pos)._roll = NAN;
  (this->pos).mergeCount = 1;
  (this->pos).f = (posFlagsTy)0x0;
  (this->pos).edgeIdx = 0xffffffffffffffff;
  return;
}

Assistant:

void ADSBHubConnection::ProcessPlaneData ()
{
    // if no timestamp then assume "3s ago"
    if (std::isnan(pos.ts()))
        dyn.ts = pos.ts() = GetSysTime() - 3.0;

    // Data collected?
    if (!fdKey.empty() && pos.isNormal(true))
    {
        // ADSBHub always sends _all_ data,
        // Filter data that the user doesn't want based on settings
        const positionTy viewPos = dataRefs.GetViewPos();
        const double dist = pos.dist(viewPos);
        if (dist < dataRefs.GetFdStdDistance_m() )
        {
            try {
                // from here on access to fdMap guarded by a mutex
                // until FD object is inserted and updated
                std::unique_lock<std::mutex> mapFdLock (mapFdMutex);

                // get the fd object from the map, key is the transpIcao
                // this fetches an existing or, if not existing, creates a new one
                LTFlightData& fd = mapFd[fdKey];
                
                // also get the data access lock once and for all
                // so following fetch/update calls only make quick recursive calls
                std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
                // now that we have the detail lock we can release the global one
                mapFdLock.unlock();

                // completely new? fill key fields
                if ( fd.empty() )
                    fd.SetKey(fdKey);
                
                // add the static data
                fd.UpdateData(stat, dist);

                // add the dynamic data
                dyn.pChannel = this;
                fd.AddDynData(dyn, 0, 0, &pos);

            } catch(const std::system_error& e) {
                LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
            }
        }
    }

    // Clear processed data
    fdKey.clear();
    stat = LTFlightData::FDStaticData();
    dyn = LTFlightData::FDDynamicData();
    pos = positionTy();
}